

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TemplateTest.hpp
# Opt level: O2

void Qentem::Test::TestRawVariableTag2(QTest *test)

{
  StringStream<char> *pSVar1;
  StringStream<char> ss;
  Value<char> value;
  StringStream<char> local_48;
  Value<char> local_30;
  
  local_48.storage_ = (char *)0x0;
  local_48.length_ = 0;
  local_48.capacity_ = 0;
  JSON::Parse<char>(&local_30,"[\"A\", \"abc\", true, 456, 1.5]");
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}{raw:0}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[3]>(test,pSVar1,(char (*) [3])0x11cdc9,0x4e0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}{raw:0}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[5]>(test,pSVar1,(char (*) [5])"abcA",0x4e4);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}{raw:2}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[8]>(test,pSVar1,(char (*) [8])"abctrue",0x4e8);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:2}{raw:3}{raw:2}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar1,(char (*) [12])"true456true",0x4ec);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}{raw:4}{raw:4}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[10]>(test,pSVar1,(char (*) [10])"1.51.51.5",0x4f0);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:0}-{raw:0}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[4]>(test,pSVar1,(char (*) [4])"A-A",0x4f6);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}--{raw:0}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[7]>(test,pSVar1,(char (*) [7])"abc--A",0x4fa);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:1}---{raw:2}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[11]>(test,pSVar1,(char (*) [11])"abc---true",0x4fe)
  ;
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:2}{raw:3}--{raw:2}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar1,(char (*) [14])"true456--true",0x502);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}--{raw:4}{raw:4}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[12]>
            (test,pSVar1,(char (*) [12])"1.5--1.51.5",0x506);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}--{raw:4}--{raw:4}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[14]>
            (test,pSVar1,(char (*) [14])"1.5--1.5--1.5",0x50a);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  pSVar1 = Template::Render<char,Qentem::Value<char>,Qentem::StringStream<char>>
                     ("{raw:4}---{raw:4}---{raw:4}",&local_30,&local_48);
  QTest::IsEqual<Qentem::StringStream<char>,char[16]>
            (test,pSVar1,(char (*) [16])"1.5---1.5---1.5",0x50e);
  local_48._8_8_ = local_48._8_8_ & 0xffffffff00000000;
  Value<char>::~Value(&local_30);
  Memory::Deallocate(local_48.storage_);
  return;
}

Assistant:

static void TestRawVariableTag2(QTest &test) {
    StringStream<char> ss;
    const Value<char>  value = JSON::Parse(R"(["A", "abc", true, 456, 1.5])");
    const char        *content;

    content = R"({raw:0}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(AA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abcA)", __LINE__);
    ss.Clear();

    content = R"({raw:1}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abctrue)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.51.51.5)", __LINE__);
    ss.Clear();

    ///

    content = R"({raw:0}-{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(A-A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}--{raw:0})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc--A)", __LINE__);
    ss.Clear();

    content = R"({raw:1}---{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(abc---true)", __LINE__);
    ss.Clear();

    content = R"({raw:2}{raw:3}--{raw:2})";
    test.IsEqual(Template::Render(content, value, ss), R"(true456--true)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.51.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}--{raw:4}--{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5--1.5--1.5)", __LINE__);
    ss.Clear();

    content = R"({raw:4}---{raw:4}---{raw:4})";
    test.IsEqual(Template::Render(content, value, ss), R"(1.5---1.5---1.5)", __LINE__);
    ss.Clear();
}